

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

Socket * sk_net_accept(accept_ctx_t ctx,Plug *plug)

{
  NetSocket *s;
  int *piVar1;
  char *pcVar2;
  
  s = (NetSocket *)safemalloc(1,0x98,0);
  (s->sock).vt = &NetSocket_sockvt;
  s->error = (char *)0x0;
  s->plug = plug;
  bufchain_init(&s->output_data);
  s->sending_oob = 0;
  s->pending_error = 0;
  s->oobpending = false;
  s->outgoingeof = EOF_NO;
  s->incomingeof = false;
  s->listener = false;
  s->addr = (SockAddr *)0x0;
  s->parent = (NetSocket *)0x0;
  s->child = (NetSocket *)0x0;
  s->connected = true;
  s->writable = true;
  s->frozen = true;
  s->localhost_only = false;
  s->s = ctx.i;
  if (ctx.i < 0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    s->error = pcVar2;
  }
  else {
    s->oobinline = false;
    uxsel_tell(s);
    add234(sktree,s);
  }
  return &s->sock;
}

Assistant:

static Socket *sk_net_accept(accept_ctx_t ctx, Plug *plug)
{
    int sockfd = ctx.i;
    NetSocket *ret;

    /*
     * Create NetSocket structure.
     */
    ret = snew(NetSocket);
    ret->sock.vt = &NetSocket_sockvt;
    ret->error = NULL;
    ret->plug = plug;
    bufchain_init(&ret->output_data);
    ret->writable = true;              /* to start with */
    ret->sending_oob = 0;
    ret->frozen = true;
    ret->localhost_only = false;    /* unused, but best init anyway */
    ret->pending_error = 0;
    ret->oobpending = false;
    ret->outgoingeof = EOF_NO;
    ret->incomingeof = false;
    ret->listener = false;
    ret->parent = ret->child = NULL;
    ret->addr = NULL;
    ret->connected = true;

    ret->s = sockfd;

    if (ret->s < 0) {
        ret->error = strerror(errno);
        return &ret->sock;
    }

    ret->oobinline = false;

    uxsel_tell(ret);
    add234(sktree, ret);

    return &ret->sock;
}